

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocalUTF8::map_utf8
          (CCharmapToLocalUTF8 *this,char *dest,size_t dest_len,utf8_ptr src,size_t src_byte_len,
          size_t *src_bytes_used)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  ulong in_RDX;
  void *in_RSI;
  ulong in_R8;
  size_t *in_R9;
  bool bVar4;
  size_t copy_len;
  ulong local_40;
  utf8_ptr local_10;
  size_t local_8;
  
  if (in_RSI == (void *)0x0) {
    local_8 = in_R8;
    if (in_R9 != (size_t *)0x0) {
      *in_R9 = 0;
    }
  }
  else {
    local_40 = in_R8;
    uVar1 = in_RDX;
    if (in_RDX < in_R8) {
      while( true ) {
        local_40 = uVar1;
        bVar4 = false;
        if (local_40 != 0) {
          pcVar3 = utf8_ptr::getptr(&local_10);
          iVar2 = utf8_ptr::s_is_continuation(pcVar3 + local_40);
          bVar4 = iVar2 != 0;
        }
        if (!bVar4) break;
        uVar1 = local_40 - 1;
      }
      if (local_40 == 0) {
        local_40 = in_RDX;
      }
    }
    if (in_RSI != (void *)0x0) {
      pcVar3 = utf8_ptr::getptr(&local_10);
      memcpy(in_RSI,pcVar3,local_40);
    }
    if (in_R9 != (size_t *)0x0) {
      *in_R9 = local_40;
    }
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

size_t CCharmapToLocalUTF8::map_utf8(char *dest, size_t dest_len,
                                     utf8_ptr src, size_t src_byte_len,
                                     size_t *src_bytes_used) const
{
    /* 
     *   if they didn't give us a destination buffer, tell them how much
     *   space is needed for the copy - this is identical to the length of
     *   the source string since we make no changes to it 
     */
    if (dest == 0)
    {
        if (src_bytes_used != 0)
            *src_bytes_used = 0;
        return src_byte_len;
    }

    /* assume we'll be able to copy the whole string */
    size_t copy_len = src_byte_len;

    /* if there's not enough space for the whole string, limit it */
    if (copy_len > dest_len)
    {
        /* copy no more than the output buffer length */
        copy_len = dest_len;

        /* 
         *   If this splits a character into two pieces, back up until we're
         *   at a character boundary - that is, the first byte of the next
         *   chunk is a non-continuation character.
         */
        while (copy_len > 0
               && utf8_ptr::s_is_continuation(src.getptr() + copy_len))
            --copy_len;

        /* 
         *   If that left us with zero bytes, just do the partial copy to
         *   ensure we don't get stuck in a zero-at-a-time infinite loop.
         */
        if (copy_len == 0)
            copy_len = dest_len;
    }

    /* if we have an output buffer, copy the data */
    if (dest != 0)
        memcpy(dest, src.getptr(), copy_len);

    /* set the amount we copied, if the caller is interested */
    if (src_bytes_used != 0)
        *src_bytes_used = copy_len;

    /* return the number of bytes we put in the destination buffer */
    return copy_len;
}